

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  undefined8 uVar7;
  int32_t index;
  uint uVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *palVar11;
  __m128i *ptr;
  __m128i *palVar12;
  __m128i *ptr_00;
  __m128i *b;
  __m128i *ptr_01;
  __m128i *b_00;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int32_t *ptr_04;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  size_t len;
  __m128i *palVar17;
  long lVar18;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  __m128i *palVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  uint uVar50;
  undefined1 auVar45 [16];
  uint uVar48;
  int iVar49;
  int iVar51;
  uint uVar52;
  int iVar53;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int32_t iVar54;
  uint uVar55;
  ulong uVar56;
  uint uVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar61;
  uint uVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar64;
  ulong uVar65;
  uint uVar69;
  undefined1 auVar66 [16];
  uint uVar68;
  uint uVar70;
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar76;
  uint uVar80;
  uint uVar81;
  undefined1 in_XMM5 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar82;
  undefined1 auVar79 [16];
  int iVar83;
  int iVar86;
  int iVar87;
  __m128i alVar84;
  undefined1 auVar85 [16];
  int iVar88;
  undefined1 in_XMM7 [16];
  undefined1 auVar89 [16];
  int iVar91;
  undefined1 auVar90 [16];
  int iVar92;
  int iVar95;
  int iVar96;
  undefined1 in_XMM8 [16];
  int iVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  uint uVar103;
  uint uVar104;
  uint uVar105;
  uint uVar106;
  undefined1 auVar107 [16];
  int iVar108;
  undefined1 auVar109 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  __m128i *local_1b0;
  int local_178;
  undefined1 local_168 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  ulong local_128;
  longlong extraout_RDX;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar76 = profile->s1Len;
        if ((int)uVar76 < 1) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_1();
        }
        else {
          uVar30 = uVar76 - 1;
          uVar28 = (ulong)uVar76 + 3 >> 2;
          uVar31 = (ulong)uVar30 % uVar28;
          iVar9 = (int)(uVar30 / uVar28);
          iVar29 = -open;
          iVar26 = ppVar4->min;
          uVar22 = 0x80000000 - iVar26;
          if (iVar26 != iVar29 && SBORROW4(iVar26,iVar29) == iVar26 + open < 0) {
            uVar22 = open | 0x80000000;
          }
          pvVar5 = (profile->profile32).matches;
          uVar8 = 0x7ffffffe - ppVar4->max;
          pvVar6 = (profile->profile32).similar;
          ppVar10 = parasail_result_new_table3((uint)((ulong)uVar76 + 3) & 0x7ffffffc,s2Len);
          if (ppVar10 != (parasail_result_t *)0x0) {
            ppVar10->flag = ppVar10->flag | 0x4430801;
            palVar11 = parasail_memalign___m128i(0x10,uVar28);
            ptr = parasail_memalign___m128i(0x10,uVar28);
            palVar12 = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign___m128i(0x10,uVar28);
            b = parasail_memalign___m128i(0x10,uVar28);
            ptr_01 = parasail_memalign___m128i(0x10,uVar28);
            b_00 = parasail_memalign___m128i(0x10,uVar28);
            ptr_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr_03 = parasail_memalign___m128i(0x10,uVar28);
            b_01 = parasail_memalign___m128i(0x10,uVar28);
            b_02 = parasail_memalign___m128i(0x10,uVar28);
            b_03 = parasail_memalign___m128i(0x10,uVar28);
            ptr_04 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            auVar71 = (undefined1  [16])0x0;
            len = CONCAT71((int7)((ulong)ptr_00 >> 8),ptr_03 == (__m128i *)0x0);
            c[1]._1_7_ = (undefined7)((ulong)ptr_01 >> 8);
            c[1]._0_1_ = b_02 == (__m128i *)0x0;
            auVar32._0_8_ = -(ulong)(palVar11 == (__m128i *)0x0);
            auVar32._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar57._0_8_ = -(ulong)(palVar12 == (__m128i *)0x0);
            auVar57._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
            auVar32 = packssdw(auVar32,auVar57);
            auVar77._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar77._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
            auVar34._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar34._8_8_ = -(ulong)(ptr_02 == (__m128i *)0x0);
            auVar57 = packssdw(auVar77,auVar34);
            auVar32 = packssdw(auVar32,auVar57);
            if (((((b_01 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) && b_02 != (__m128i *)0x0)
                 && b_03 != (__m128i *)0x0) && ptr_04 != (int32_t *)0x0) &&
                ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar32 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar32 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar32 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar32 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar32 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar32[0xf])) {
              iVar26 = s2Len + -1;
              uVar22 = uVar22 + 1;
              c[0] = uVar28;
              parasail_memset___m128i(palVar12,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar28;
              parasail_memset___m128i(b,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar28;
              parasail_memset___m128i(b_00,c_01,len);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar28;
              parasail_memset___m128i(b_01,c_02,len);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar28;
              parasail_memset___m128i(b_02,c_03,len);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar28;
              parasail_memset___m128i(b_03,c_04,len);
              auVar109._4_4_ = gap;
              auVar109._0_4_ = gap;
              auVar109._8_4_ = gap;
              auVar109._12_4_ = gap;
              auVar45._4_4_ = iVar29;
              auVar45._0_4_ = iVar29;
              auVar45._8_4_ = iVar29;
              auVar45._12_4_ = iVar29;
              local_128 = CONCAT44(0,open);
              auVar58._8_4_ = open;
              auVar58._0_8_ = local_128;
              auVar58._12_4_ = 0;
              auVar66._8_4_ = (int)uVar28;
              auVar66._0_8_ = uVar28;
              auVar66._12_4_ = 0;
              auVar32 = pmovsxbq(auVar71,0x302);
              auVar57 = pmuldq(auVar32,auVar66);
              auVar32 = pmuldq(auVar66,_DAT_00903a90);
              uVar13 = 0;
              auVar77 = pmovsxdq(in_XMM5,0x8000000080000000);
              palVar17 = palVar11;
              palVar19 = ptr_03;
              do {
                auVar71._8_4_ = (int)uVar13;
                auVar71._0_8_ = uVar13;
                auVar71._12_4_ = (int)(uVar13 >> 0x20);
                auVar33._0_4_ = (undefined4)(uVar13 + auVar32._0_8_);
                auVar33._4_4_ = (int)(auVar71._8_8_ + auVar32._8_8_);
                auVar33._8_4_ = (int)(auVar57._0_8_ + uVar13);
                auVar33._12_4_ = (int)(auVar57._8_8_ + auVar71._8_8_);
                auVar34 = pmulld(auVar33,auVar109);
                alVar84[0]._0_4_ = iVar29 - auVar34._0_4_;
                alVar84[0]._4_4_ = iVar29 - auVar34._4_4_;
                alVar84[1]._0_4_ = iVar29 - auVar34._8_4_;
                alVar84[1]._4_4_ = iVar29 - auVar34._12_4_;
                auVar34 = pmovsxdq(in_XMM7,(undefined1  [16])alVar84);
                auVar35._4_4_ = alVar84[1]._4_4_;
                auVar35._0_4_ = (int)alVar84[1];
                auVar35._8_4_ = (int)alVar84[1];
                auVar35._12_4_ = alVar84[1]._4_4_;
                auVar71 = pmovsxdq(in_XMM8,auVar35);
                in_XMM8._0_8_ = auVar71._0_8_ - local_128;
                in_XMM8._8_8_ = auVar71._8_8_ - (ulong)(uint)open;
                auVar89._0_8_ = auVar34._0_8_ - local_128;
                auVar89._8_8_ = auVar34._8_8_ - (ulong)(uint)open;
                auVar36._0_8_ = -(ulong)(auVar77._0_8_ < auVar89._0_8_);
                auVar36._8_8_ = -(ulong)(auVar77._8_8_ < auVar89._8_8_);
                auVar34 = blendvpd(auVar77,auVar89,auVar36);
                auVar37._0_8_ = -(ulong)(auVar77._0_8_ < in_XMM8._0_8_);
                auVar37._8_8_ = -(ulong)(auVar77._8_8_ < in_XMM8._8_8_);
                in_XMM7 = blendvpd(auVar77,in_XMM8,auVar37);
                *palVar17 = alVar84;
                *(int *)*palVar19 = auVar34._0_4_;
                *(int *)((long)*palVar19 + 4) = auVar34._8_4_;
                *(int *)(*palVar19 + 1) = in_XMM7._0_4_;
                *(int *)((long)*palVar19 + 0xc) = in_XMM7._8_4_;
                uVar13 = uVar13 + 1;
                palVar19 = palVar19 + 1;
                palVar17 = palVar17 + 1;
              } while (uVar28 != uVar13);
              *ptr_04 = 0;
              auVar32 = _DAT_00906ca0;
              uVar13 = (ulong)(uint)s2Len;
              lVar14 = uVar13 - 1;
              auVar38._8_4_ = (int)lVar14;
              auVar38._0_8_ = lVar14;
              auVar38._12_4_ = (int)((ulong)lVar14 >> 0x20);
              uVar24 = 0;
              auVar57 = pmovsxbq(auVar45,0x302);
              auVar77 = pmovsxbq(auVar58,0x100);
              auVar38 = auVar38 ^ _DAT_00906ca0;
              do {
                uVar41 = auVar32._0_8_;
                lVar14 = auVar38._0_8_;
                if ((bool)(~(lVar14 < (long)(uVar24 ^ uVar41)) & 1)) {
                  ptr_04[uVar24 + 1] = iVar29;
                }
                auVar78._8_4_ = (int)uVar24;
                auVar78._0_8_ = uVar24;
                auVar78._12_4_ = (int)(uVar24 >> 0x20);
                if ((long)((auVar78._8_8_ | auVar77._8_8_) ^ auVar32._8_8_) <= auVar38._8_8_) {
                  ptr_04[uVar24 + 2] = iVar29 - gap;
                }
                if ((long)((uVar24 | auVar57._0_8_) ^ uVar41) <= lVar14) {
                  ptr_04[uVar24 + 3] = gap * -2 + iVar29;
                  ptr_04[uVar24 + 4] = gap * -3 + iVar29;
                }
                uVar24 = uVar24 + 4;
                iVar29 = iVar29 + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != uVar24);
              uVar16 = (int)uVar28 - 1;
              lVar20 = uVar28 * uVar13;
              lVar14 = lVar20 * 4;
              lVar21 = lVar20 * 8;
              lVar20 = lVar20 * 0xc;
              lVar27 = 0;
              uVar24 = 0;
              uVar76 = uVar22;
              uVar80 = uVar22;
              uVar81 = uVar22;
              uVar82 = uVar22;
              local_158 = uVar8;
              uStack_154 = uVar8;
              uStack_150 = uVar8;
              uStack_14c = uVar8;
              do {
                local_1b0 = ptr_00;
                local_1b8 = ptr_01;
                local_1c0 = ptr_02;
                local_1c8 = ptr;
                ptr_01 = b;
                ptr_02 = b_00;
                ptr = palVar11;
                ptr_00 = palVar12;
                palVar12 = ptr + uVar16;
                palVar11 = ptr_00 + uVar16;
                iVar88 = (int)(*palVar11)[0];
                iVar108 = *(int *)((long)*palVar11 + 4);
                iVar91 = (int)(*palVar11)[1];
                palVar11 = ptr_01 + uVar16;
                iVar95 = (int)(*palVar11)[0];
                iVar96 = *(int *)((long)*palVar11 + 4);
                iVar97 = (int)(*palVar11)[1];
                palVar11 = ptr_02 + uVar16;
                iVar49 = (int)(*palVar11)[0];
                iVar51 = *(int *)((long)*palVar11 + 4);
                iVar53 = (int)(*palVar11)[1];
                iVar87 = 0;
                iVar92 = 0;
                iVar43 = 0;
                palVar11 = ptr + uVar16;
                iVar29 = (int)(*palVar11)[0];
                iVar83 = *(int *)((long)*palVar11 + 4);
                iVar86 = (int)(*palVar11)[1];
                iVar54 = ptr_04[uVar24];
                lVar18 = (long)ppVar4->mapper[(byte)s2[uVar24]] * uVar28 * 0x10;
                local_168 = (undefined1  [16])0x0;
                lVar23 = 0;
                auVar98 = ZEXT816(0);
                lVar15 = lVar27;
                auVar73 = _DAT_00905160;
                uVar103 = uVar22;
                uVar104 = uVar22;
                uVar105 = uVar22;
                uVar106 = uVar22;
                do {
                  piVar1 = (int *)((long)*ptr_03 + lVar23);
                  iVar99 = *piVar1;
                  iVar100 = piVar1[1];
                  iVar101 = piVar1[2];
                  iVar102 = piVar1[3];
                  auVar32 = *(undefined1 (*) [16])((long)*b_01 + lVar23);
                  auVar57 = *(undefined1 (*) [16])((long)*b_02 + lVar23);
                  auVar77 = *(undefined1 (*) [16])((long)*b_03 + lVar23);
                  piVar1 = (int *)((long)pvVar3 + lVar23 + lVar18);
                  uVar55 = iVar54 + *piVar1;
                  uVar61 = iVar29 + piVar1[1];
                  uVar62 = iVar83 + piVar1[2];
                  uVar63 = iVar86 + piVar1[3];
                  uVar64 = (uint)((int)uVar55 < iVar99) * iVar99 | ((int)uVar55 >= iVar99) * uVar55;
                  uVar68 = (uint)((int)uVar61 < iVar100) * iVar100 |
                           ((int)uVar61 >= iVar100) * uVar61;
                  uVar69 = (uint)((int)uVar62 < iVar101) * iVar101 |
                           ((int)uVar62 >= iVar101) * uVar62;
                  uVar70 = (uint)((int)uVar63 < iVar102) * iVar102 |
                           ((int)uVar63 >= iVar102) * uVar63;
                  uVar42 = ((int)uVar64 < (int)uVar103) * uVar103 |
                           ((int)uVar64 >= (int)uVar103) * uVar64;
                  uVar48 = ((int)uVar68 < (int)uVar104) * uVar104 |
                           ((int)uVar68 >= (int)uVar104) * uVar68;
                  uVar50 = ((int)uVar69 < (int)uVar105) * uVar105 |
                           ((int)uVar69 >= (int)uVar105) * uVar69;
                  uVar52 = ((int)uVar70 < (int)uVar106) * uVar106 |
                           ((int)uVar70 >= (int)uVar106) * uVar70;
                  puVar2 = (uint *)((long)*local_1c8 + lVar23);
                  *puVar2 = uVar42;
                  puVar2[1] = uVar48;
                  puVar2[2] = uVar50;
                  puVar2[3] = uVar52;
                  auVar67._0_4_ = -(uint)((int)uVar103 < (int)uVar64);
                  auVar67._4_4_ = -(uint)((int)uVar104 < (int)uVar68);
                  auVar67._8_4_ = -(uint)((int)uVar105 < (int)uVar69);
                  auVar67._12_4_ = -(uint)((int)uVar106 < (int)uVar70);
                  auVar34 = blendvps(auVar98,auVar32,auVar67);
                  piVar1 = (int *)((long)pvVar5 + lVar23 + lVar18);
                  auVar90._0_4_ = iVar87 + *piVar1;
                  auVar90._4_4_ = iVar88 + piVar1[1];
                  auVar90._8_4_ = iVar108 + piVar1[2];
                  auVar90._12_4_ = iVar91 + piVar1[3];
                  auVar59._0_4_ = -(uint)(uVar55 == uVar42);
                  auVar59._4_4_ = -(uint)(uVar61 == uVar48);
                  auVar59._8_4_ = -(uint)(uVar62 == uVar50);
                  auVar59._12_4_ = -(uint)(uVar63 == uVar52);
                  auVar109 = blendvps(auVar34,auVar90,auVar59);
                  *(undefined1 (*) [16])((long)*local_1b0 + lVar23) = auVar109;
                  auVar34 = blendvps(local_168,auVar57,auVar67);
                  piVar1 = (int *)((long)pvVar6 + lVar23 + lVar18);
                  auVar93._0_4_ = iVar92 + *piVar1;
                  auVar93._4_4_ = iVar95 + piVar1[1];
                  auVar93._8_4_ = iVar96 + piVar1[2];
                  auVar93._12_4_ = iVar97 + piVar1[3];
                  auVar34 = blendvps(auVar34,auVar93,auVar59);
                  *(undefined1 (*) [16])((long)*local_1b8 + lVar23) = auVar34;
                  auVar71 = blendvps(auVar73,auVar77,auVar67);
                  auVar85._0_4_ = iVar43 + 1;
                  auVar85._4_4_ = iVar49 + 1;
                  auVar85._8_4_ = iVar51 + 1;
                  auVar85._12_4_ = iVar53 + 1;
                  auVar71 = blendvps(auVar71,auVar85,auVar59);
                  *(undefined1 (*) [16])((long)*local_1c0 + lVar23) = auVar71;
                  lVar25 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 8);
                  iVar108 = auVar109._0_4_;
                  *(int *)(lVar25 + lVar15) = iVar108;
                  lVar25 = lVar25 + lVar15;
                  uVar7 = extractps(auVar109,1);
                  *(undefined8 *)(lVar14 + lVar25) = uVar7;
                  uVar7 = extractps(auVar109,2);
                  *(undefined8 *)(lVar21 + lVar25) = uVar7;
                  uVar7 = extractps(auVar109,3);
                  *(undefined8 *)(lVar20 + lVar25) = uVar7;
                  lVar25 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x10);
                  iVar29 = auVar34._0_4_;
                  *(int *)(lVar25 + lVar15) = iVar29;
                  lVar25 = lVar25 + lVar15;
                  uVar7 = extractps(auVar34,1);
                  *(undefined8 *)(lVar14 + lVar25) = uVar7;
                  uVar7 = extractps(auVar34,2);
                  *(undefined8 *)(lVar21 + lVar25) = uVar7;
                  uVar7 = extractps(auVar34,3);
                  *(undefined8 *)(lVar20 + lVar25) = uVar7;
                  lVar25 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x18);
                  iVar87 = auVar71._0_4_;
                  *(int *)(lVar25 + lVar15) = iVar87;
                  lVar25 = lVar25 + lVar15;
                  uVar7 = extractps(auVar71,1);
                  *(undefined8 *)(lVar14 + lVar25) = uVar7;
                  uVar7 = extractps(auVar71,2);
                  *(undefined8 *)(lVar21 + lVar25) = uVar7;
                  uVar7 = extractps(auVar71,3);
                  *(undefined8 *)(lVar20 + lVar25) = uVar7;
                  lVar25 = *((ppVar10->field_4).trace)->trace_del_table;
                  *(uint *)(lVar25 + lVar15) = uVar42;
                  lVar25 = lVar25 + lVar15;
                  *(uint *)(lVar14 + lVar25) = uVar48;
                  *(uint *)(lVar21 + lVar25) = uVar50;
                  *(uint *)(lVar20 + lVar25) = uVar52;
                  local_158 = ((int)uVar42 < (int)local_158) * uVar42 |
                              ((int)uVar42 >= (int)local_158) * local_158;
                  uStack_154 = ((int)uVar48 < (int)uStack_154) * uVar48 |
                               ((int)uVar48 >= (int)uStack_154) * uStack_154;
                  uStack_150 = ((int)uVar50 < (int)uStack_150) * uVar50 |
                               ((int)uVar50 >= (int)uStack_150) * uStack_150;
                  uStack_14c = ((int)uVar52 < (int)uStack_14c) * uVar52 |
                               ((int)uVar52 >= (int)uStack_14c) * uStack_14c;
                  uVar76 = ((int)uVar76 < (int)uVar42) * uVar42 |
                           ((int)uVar76 >= (int)uVar42) * uVar76;
                  uVar80 = ((int)uVar80 < (int)uVar48) * uVar48 |
                           ((int)uVar80 >= (int)uVar48) * uVar80;
                  uVar81 = ((int)uVar81 < (int)uVar50) * uVar50 |
                           ((int)uVar81 >= (int)uVar50) * uVar81;
                  uVar82 = ((int)uVar82 < (int)uVar52) * uVar52 |
                           ((int)uVar82 >= (int)uVar52) * uVar82;
                  uVar55 = (uint)(iVar29 < iVar87) * iVar87 | (uint)(iVar29 >= iVar87) * iVar29;
                  iVar29 = auVar71._4_4_;
                  iVar83 = auVar34._4_4_;
                  uVar61 = (uint)(iVar83 < iVar29) * iVar29 | (uint)(iVar83 >= iVar29) * iVar83;
                  iVar83 = auVar71._8_4_;
                  iVar86 = auVar34._8_4_;
                  iVar43 = auVar34._12_4_;
                  uVar62 = (uint)(iVar86 < iVar83) * iVar83 | (uint)(iVar86 >= iVar83) * iVar86;
                  iVar86 = auVar71._12_4_;
                  uVar63 = (uint)(iVar43 < iVar86) * iVar86 | (uint)(iVar43 >= iVar86) * iVar43;
                  iVar43 = uVar42 - open;
                  iVar49 = uVar48 - open;
                  iVar51 = uVar50 - open;
                  iVar53 = uVar52 - open;
                  iVar99 = iVar99 - gap;
                  iVar100 = iVar100 - gap;
                  iVar101 = iVar101 - gap;
                  iVar102 = iVar102 - gap;
                  auVar39._0_4_ = -(uint)(iVar99 < iVar43);
                  auVar39._4_4_ = -(uint)(iVar100 < iVar49);
                  auVar39._8_4_ = -(uint)(iVar101 < iVar51);
                  auVar39._12_4_ = -(uint)(iVar102 < iVar53);
                  auVar32 = blendvps(auVar32,auVar109,auVar39);
                  auVar57 = blendvps(auVar57,auVar34,auVar39);
                  auVar107._0_4_ = auVar77._0_4_ + 1;
                  auVar107._4_4_ = auVar77._4_4_ + 1;
                  auVar107._8_4_ = auVar77._8_4_ + 1;
                  auVar107._12_4_ = auVar77._12_4_ + 1;
                  auVar94._0_4_ = iVar87 + 1;
                  auVar94._4_4_ = iVar29 + 1;
                  auVar94._8_4_ = iVar83 + 1;
                  auVar94._12_4_ = iVar86 + 1;
                  auVar77 = blendvps(auVar107,auVar94,auVar39);
                  iVar83 = uVar103 - gap;
                  iVar86 = uVar104 - gap;
                  iVar87 = uVar105 - gap;
                  iVar88 = uVar106 - gap;
                  auVar46._0_4_ = -(uint)(iVar83 < iVar43);
                  auVar46._4_4_ = -(uint)(iVar86 < iVar49);
                  auVar46._8_4_ = -(uint)(iVar87 < iVar51);
                  auVar46._12_4_ = -(uint)(iVar88 < iVar53);
                  auVar98 = blendvps(auVar98,auVar109,auVar46);
                  local_168 = blendvps(local_168,auVar34,auVar46);
                  uVar76 = (uint)((int)uVar76 < iVar108) * iVar108 |
                           ((int)uVar76 >= iVar108) * uVar76;
                  iVar29 = auVar109._4_4_;
                  uVar80 = (uint)((int)uVar80 < iVar29) * iVar29 | ((int)uVar80 >= iVar29) * uVar80;
                  iVar29 = auVar109._8_4_;
                  uVar81 = (uint)((int)uVar81 < iVar29) * iVar29 | ((int)uVar81 >= iVar29) * uVar81;
                  iVar29 = auVar109._12_4_;
                  uVar82 = (uint)((int)uVar82 < iVar29) * iVar29 | ((int)uVar82 >= iVar29) * uVar82;
                  uVar76 = ((int)uVar55 < (int)uVar76) * uVar76 |
                           ((int)uVar55 >= (int)uVar76) * uVar55;
                  uVar80 = ((int)uVar61 < (int)uVar80) * uVar80 |
                           ((int)uVar61 >= (int)uVar80) * uVar61;
                  uVar81 = ((int)uVar62 < (int)uVar81) * uVar81 |
                           ((int)uVar62 >= (int)uVar81) * uVar62;
                  uVar82 = ((int)uVar63 < (int)uVar82) * uVar82 |
                           ((int)uVar63 >= (int)uVar82) * uVar63;
                  puVar2 = (uint *)((long)*ptr_03 + lVar23);
                  *puVar2 = (uint)(iVar43 < iVar99) * iVar99 | (uint)(iVar43 >= iVar99) * iVar43;
                  puVar2[1] = (uint)(iVar49 < iVar100) * iVar100 |
                              (uint)(iVar49 >= iVar100) * iVar49;
                  puVar2[2] = (uint)(iVar51 < iVar101) * iVar101 |
                              (uint)(iVar51 >= iVar101) * iVar51;
                  puVar2[3] = (uint)(iVar53 < iVar102) * iVar102 |
                              (uint)(iVar53 >= iVar102) * iVar53;
                  *(undefined1 (*) [16])((long)*b_01 + lVar23) = auVar32;
                  *(undefined1 (*) [16])((long)*b_02 + lVar23) = auVar57;
                  *(undefined1 (*) [16])((long)*b_03 + lVar23) = auVar77;
                  auVar72._0_4_ = auVar73._0_4_ + 1;
                  auVar72._4_4_ = auVar73._4_4_ + 1;
                  auVar72._8_4_ = auVar73._8_4_ + 1;
                  auVar72._12_4_ = auVar73._12_4_ + 1;
                  auVar73 = blendvps(auVar72,auVar94,auVar46);
                  uVar103 = (uint)(iVar43 < iVar83) * iVar83 | (uint)(iVar43 >= iVar83) * iVar43;
                  uVar104 = (uint)(iVar49 < iVar86) * iVar86 | (uint)(iVar49 >= iVar86) * iVar49;
                  uVar105 = (uint)(iVar51 < iVar87) * iVar87 | (uint)(iVar51 >= iVar87) * iVar51;
                  uVar106 = (uint)(iVar53 < iVar88) * iVar88 | (uint)(iVar53 >= iVar88) * iVar53;
                  piVar1 = (int *)((long)*ptr + lVar23);
                  iVar54 = *piVar1;
                  iVar29 = piVar1[1];
                  iVar83 = piVar1[2];
                  iVar86 = piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar23);
                  iVar87 = *piVar1;
                  iVar88 = piVar1[1];
                  iVar108 = piVar1[2];
                  iVar91 = piVar1[3];
                  piVar1 = (int *)((long)*ptr_01 + lVar23);
                  iVar92 = *piVar1;
                  iVar95 = piVar1[1];
                  iVar96 = piVar1[2];
                  iVar97 = piVar1[3];
                  piVar1 = (int *)((long)*ptr_02 + lVar23);
                  iVar43 = *piVar1;
                  iVar49 = piVar1[1];
                  iVar51 = piVar1[2];
                  iVar53 = piVar1[3];
                  lVar23 = lVar23 + 0x10;
                  lVar15 = lVar15 + uVar13 * 4;
                } while (uVar28 << 4 != lVar23);
                local_178 = 0;
                do {
                  iVar29 = (int)(*palVar12)[0];
                  iVar83 = *(int *)((long)*palVar12 + 4);
                  iVar86 = (int)(*palVar12)[1];
                  iVar54 = ptr_04[uVar24];
                  auVar74._0_4_ = auVar73._0_4_;
                  auVar74._4_4_ = auVar74._0_4_;
                  auVar74._8_4_ = auVar73._4_4_;
                  auVar74._12_4_ = auVar73._8_4_;
                  auVar73._8_8_ = auVar74._8_8_;
                  auVar73._0_8_ = (ulong)auVar74._0_4_ << 0x20 | 1;
                  lVar15 = auVar98._8_8_;
                  uVar41 = auVar98._0_8_;
                  auVar98._0_8_ = uVar41 << 0x20;
                  auVar98._8_8_ = lVar15 << 0x20 | uVar41 >> 0x20;
                  lVar15 = local_168._8_8_;
                  uVar41 = local_168._0_8_;
                  local_168._0_8_ = uVar41 << 0x20;
                  local_168._8_8_ = lVar15 << 0x20 | uVar41 >> 0x20;
                  lVar23 = 0;
                  lVar15 = lVar27;
                  uVar106 = ptr_04[uVar24 + 1] - open;
                  uVar42 = uVar103;
                  uVar48 = uVar104;
                  uVar50 = uVar105;
                  do {
                    piVar1 = (int *)((long)pvVar3 + lVar23 + lVar18);
                    iVar43 = *piVar1;
                    iVar49 = piVar1[1];
                    iVar51 = piVar1[2];
                    iVar53 = piVar1[3];
                    piVar1 = (int *)((long)*local_1c8 + lVar23);
                    iVar87 = *piVar1;
                    iVar88 = piVar1[1];
                    iVar108 = piVar1[2];
                    iVar91 = piVar1[3];
                    uVar52 = (iVar87 < (int)uVar106) * uVar106 |
                             (uint)(iVar87 >= (int)uVar106) * iVar87;
                    uVar55 = (iVar88 < (int)uVar42) * uVar42 |
                             (uint)(iVar88 >= (int)uVar42) * iVar88;
                    uVar61 = (iVar108 < (int)uVar48) * uVar48 |
                             (uint)(iVar108 >= (int)uVar48) * iVar108;
                    uVar62 = (iVar91 < (int)uVar50) * uVar50 |
                             (uint)(iVar91 >= (int)uVar50) * iVar91;
                    puVar2 = (uint *)((long)*local_1c8 + lVar23);
                    *puVar2 = uVar52;
                    puVar2[1] = uVar55;
                    puVar2[2] = uVar61;
                    puVar2[3] = uVar62;
                    auVar60._0_4_ = -(uint)(iVar54 + iVar43 == uVar52);
                    auVar60._4_4_ = -(uint)(iVar29 + iVar49 == uVar55);
                    auVar60._8_4_ = -(uint)(iVar83 + iVar51 == uVar61);
                    auVar60._12_4_ = -(uint)(iVar86 + iVar53 == uVar62);
                    auVar40._0_4_ = -(uint)((int)uVar106 < iVar87);
                    auVar40._4_4_ = -(uint)((int)uVar42 < iVar88);
                    auVar40._8_4_ = -(uint)((int)uVar48 < iVar108);
                    auVar40._12_4_ = -(uint)((int)uVar50 < iVar91);
                    auVar40 = auVar40 | auVar60;
                    auVar32 = blendvps(auVar98,*(undefined1 (*) [16])((long)*local_1b0 + lVar23),
                                       auVar40);
                    *(undefined1 (*) [16])((long)*local_1b0 + lVar23) = auVar32;
                    auVar57 = blendvps(local_168,*(undefined1 (*) [16])((long)*local_1b8 + lVar23),
                                       auVar40);
                    *(undefined1 (*) [16])((long)*local_1b8 + lVar23) = auVar57;
                    auVar77 = blendvps(auVar73,*(undefined1 (*) [16])((long)*local_1c0 + lVar23),
                                       auVar40);
                    *(undefined1 (*) [16])((long)*local_1c0 + lVar23) = auVar77;
                    lVar25 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 8);
                    iVar29 = auVar32._0_4_;
                    *(int *)(lVar25 + lVar15) = iVar29;
                    lVar25 = lVar25 + lVar15;
                    uVar7 = extractps(auVar32,1);
                    *(undefined8 *)(lVar14 + lVar25) = uVar7;
                    uVar7 = extractps(auVar32,2);
                    *(undefined8 *)(lVar21 + lVar25) = uVar7;
                    uVar7 = extractps(auVar32,3);
                    *(undefined8 *)(lVar20 + lVar25) = uVar7;
                    lVar25 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x10);
                    iVar83 = auVar57._0_4_;
                    *(int *)(lVar25 + lVar15) = iVar83;
                    lVar25 = lVar25 + lVar15;
                    uVar7 = extractps(auVar57,1);
                    *(undefined8 *)(lVar14 + lVar25) = uVar7;
                    uVar7 = extractps(auVar57,2);
                    *(undefined8 *)(lVar21 + lVar25) = uVar7;
                    uVar7 = extractps(auVar57,3);
                    *(undefined8 *)(lVar20 + lVar25) = uVar7;
                    local_158 = ((int)uVar52 < (int)local_158) * uVar52 |
                                ((int)uVar52 >= (int)local_158) * local_158;
                    uStack_154 = ((int)uVar55 < (int)uStack_154) * uVar55 |
                                 ((int)uVar55 >= (int)uStack_154) * uStack_154;
                    uStack_150 = ((int)uVar61 < (int)uStack_150) * uVar61 |
                                 ((int)uVar61 >= (int)uStack_150) * uStack_150;
                    uStack_14c = ((int)uVar62 < (int)uStack_14c) * uVar62 |
                                 ((int)uVar62 >= (int)uStack_14c) * uStack_14c;
                    lVar25 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x18);
                    iVar49 = auVar77._0_4_;
                    *(int *)(lVar25 + lVar15) = iVar49;
                    lVar25 = lVar25 + lVar15;
                    uVar7 = extractps(auVar77,1);
                    *(undefined8 *)(lVar14 + lVar25) = uVar7;
                    uVar7 = extractps(auVar77,2);
                    *(undefined8 *)(lVar21 + lVar25) = uVar7;
                    uVar7 = extractps(auVar77,3);
                    *(undefined8 *)(lVar20 + lVar25) = uVar7;
                    uVar76 = ((int)uVar76 < (int)uVar52) * uVar52 |
                             ((int)uVar76 >= (int)uVar52) * uVar76;
                    uVar80 = ((int)uVar80 < (int)uVar55) * uVar55 |
                             ((int)uVar80 >= (int)uVar55) * uVar80;
                    uVar81 = ((int)uVar81 < (int)uVar61) * uVar61 |
                             ((int)uVar81 >= (int)uVar61) * uVar81;
                    uVar82 = ((int)uVar82 < (int)uVar62) * uVar62 |
                             ((int)uVar82 >= (int)uVar62) * uVar82;
                    uVar76 = (uint)((int)uVar76 < iVar29) * iVar29 |
                             ((int)uVar76 >= iVar29) * uVar76;
                    iVar29 = auVar32._4_4_;
                    uVar80 = (uint)((int)uVar80 < iVar29) * iVar29 |
                             ((int)uVar80 >= iVar29) * uVar80;
                    iVar29 = auVar32._8_4_;
                    uVar81 = (uint)((int)uVar81 < iVar29) * iVar29 |
                             ((int)uVar81 >= iVar29) * uVar81;
                    iVar29 = auVar32._12_4_;
                    uVar82 = (uint)((int)uVar82 < iVar29) * iVar29 |
                             ((int)uVar82 >= iVar29) * uVar82;
                    lVar25 = *((ppVar10->field_4).trace)->trace_del_table;
                    *(uint *)(lVar25 + lVar15) = uVar52;
                    lVar25 = lVar25 + lVar15;
                    *(uint *)(lVar14 + lVar25) = uVar55;
                    *(uint *)(lVar21 + lVar25) = uVar61;
                    *(uint *)(lVar20 + lVar25) = uVar62;
                    iVar86 = auVar57._4_4_;
                    iVar43 = auVar57._12_4_;
                    uVar103 = (uint)(iVar83 < iVar49) * iVar49 | (uint)(iVar83 >= iVar49) * iVar83;
                    iVar29 = auVar77._4_4_;
                    uVar104 = (uint)(iVar86 < iVar29) * iVar29 | (uint)(iVar86 >= iVar29) * iVar86;
                    iVar29 = auVar77._8_4_;
                    iVar83 = auVar57._8_4_;
                    uVar105 = (uint)(iVar83 < iVar29) * iVar29 | (uint)(iVar83 >= iVar29) * iVar83;
                    iVar29 = auVar77._12_4_;
                    uVar63 = (uint)(iVar43 < iVar29) * iVar29 | (uint)(iVar43 >= iVar29) * iVar43;
                    uVar76 = ((int)uVar103 < (int)uVar76) * uVar76 |
                             ((int)uVar103 >= (int)uVar76) * uVar103;
                    uVar80 = ((int)uVar104 < (int)uVar80) * uVar80 |
                             ((int)uVar104 >= (int)uVar80) * uVar104;
                    uVar81 = ((int)uVar105 < (int)uVar81) * uVar81 |
                             ((int)uVar105 >= (int)uVar81) * uVar105;
                    uVar82 = ((int)uVar63 < (int)uVar82) * uVar82 |
                             ((int)uVar63 >= (int)uVar82) * uVar63;
                    uVar103 = uVar106 - gap;
                    uVar104 = uVar42 - gap;
                    uVar105 = uVar48 - gap;
                    uVar50 = uVar50 - gap;
                    auVar47._0_4_ = -(uint)((int)uVar103 < (int)(uVar52 - open));
                    auVar47._4_4_ = -(uint)((int)uVar104 < (int)(uVar55 - open));
                    auVar47._8_4_ = -(uint)((int)uVar105 < (int)(uVar61 - open));
                    auVar47._12_4_ = -(uint)((int)uVar50 < (int)(uVar62 - open));
                    iVar29 = movmskps((int)lVar25,auVar47);
                    if (iVar29 == 0xf) goto LAB_006f03a6;
                    auVar98 = blendvps(auVar98,auVar32,auVar47);
                    local_168 = blendvps(local_168,auVar57,auVar47);
                    auVar32 = blendvps(auVar73,auVar77,auVar47);
                    auVar73._0_4_ = auVar32._0_4_ + 1;
                    auVar73._4_4_ = auVar32._4_4_ + 1;
                    auVar73._8_4_ = auVar32._8_4_ + 1;
                    auVar73._12_4_ = auVar32._12_4_ + 1;
                    piVar1 = (int *)((long)*ptr + lVar23);
                    iVar54 = *piVar1;
                    iVar29 = piVar1[1];
                    iVar83 = piVar1[2];
                    iVar86 = piVar1[3];
                    lVar23 = lVar23 + 0x10;
                    lVar15 = lVar15 + uVar13 * 4;
                    uVar106 = uVar103;
                    uVar42 = uVar104;
                    uVar48 = uVar105;
                  } while (uVar28 << 4 != lVar23);
                  local_178 = local_178 + 1;
                } while (local_178 != 4);
LAB_006f03a6:
                uVar24 = uVar24 + 1;
                lVar27 = lVar27 + 4;
                palVar12 = local_1b0;
                palVar11 = local_1c8;
                b_00 = local_1c0;
                b = local_1b8;
                if (uVar24 == uVar13) {
                  iVar29 = (int)uVar31 * 0x10;
                  uVar28 = local_1c8[uVar31][1];
                  uVar13 = local_1b0[uVar31][1];
                  uVar24 = local_1b8[uVar31][1];
                  uVar41 = local_1c0[uVar31][1];
                  if (iVar9 < 3) {
                    iVar29 = 0;
                    uVar65 = local_1c8[uVar31][0];
                    uVar56 = local_1b0[uVar31][0];
                    uVar44 = local_1b8[uVar31][0];
                    uVar31 = local_1c0[uVar31][0];
                    do {
                      uVar28 = uVar28 << 0x20 | uVar65 >> 0x20;
                      uVar13 = uVar13 << 0x20 | uVar56 >> 0x20;
                      uVar24 = uVar24 << 0x20 | uVar44 >> 0x20;
                      uVar41 = uVar41 << 0x20 | uVar31 >> 0x20;
                      iVar29 = iVar29 + 1;
                      uVar65 = uVar65 << 0x20;
                      uVar56 = uVar56 << 0x20;
                      uVar44 = uVar44 << 0x20;
                      uVar31 = uVar31 << 0x20;
                    } while (iVar29 < 3 - iVar9);
                  }
                  auVar75._0_4_ = -(uint)((int)local_158 < (int)uVar22);
                  auVar75._4_4_ = -(uint)((int)uStack_154 < (int)uVar22);
                  auVar75._8_4_ = -(uint)((int)uStack_150 < (int)uVar22);
                  auVar75._12_4_ = -(uint)((int)uStack_14c < (int)uVar22);
                  auVar79._0_4_ = -(uint)((int)uVar8 < (int)uVar76);
                  auVar79._4_4_ = -(uint)((int)uVar8 < (int)uVar80);
                  auVar79._8_4_ = -(uint)((int)uVar8 < (int)uVar81);
                  auVar79._12_4_ = -(uint)((int)uVar8 < (int)uVar82);
                  iVar9 = movmskps(iVar29,auVar79 | auVar75);
                  if (iVar9 == 0) {
                    iVar9 = (int)(uVar28 >> 0x20);
                    iVar29 = (int)(uVar13 >> 0x20);
                    iVar83 = (int)(uVar24 >> 0x20);
                    iVar86 = (int)(uVar41 >> 0x20);
                  }
                  else {
                    *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                    iVar9 = 0;
                    iVar29 = 0;
                    iVar83 = 0;
                    iVar86 = 0;
                    iVar26 = 0;
                    uVar30 = 0;
                  }
                  ppVar10->score = iVar9;
                  ppVar10->end_query = uVar30;
                  ppVar10->end_ref = iVar26;
                  ((ppVar10->field_4).stats)->matches = iVar29;
                  ((ppVar10->field_4).stats)->similar = iVar83;
                  ((ppVar10->field_4).stats)->length = iVar86;
                  parasail_free(ptr_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_1c0);
                  parasail_free(ptr_01);
                  parasail_free(local_1b8);
                  parasail_free(ptr_00);
                  parasail_free(local_1b0);
                  parasail_free(ptr);
                  parasail_free(local_1c8);
                  return ppVar10;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 4);
                vHM = _mm_slli_si128 (vHM, 4);
                vHS = _mm_slli_si128 (vHS, 4);
                vHL = _mm_slli_si128 (vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
            vHM = _mm_slli_si128 (vHM, 4);
            vHS = _mm_slli_si128 (vHS, 4);
            vHL = _mm_slli_si128 (vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}